

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::PoolAllocator::fastFree(PoolAllocator *this,void *ptr)

{
  bool bVar1;
  pointer ppVar2;
  void *in_RSI;
  const_iterator in_RDI;
  size_t size;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff98;
  _List_node_base **__y;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffffa0;
  _Self in_stack_ffffffffffffffb0;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_30;
  unsigned_long local_28;
  _Self local_20;
  _Self local_18;
  void *local_10;
  
  local_10 = in_RSI;
  Mutex::lock((Mutex *)0x116771);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      Mutex::unlock((Mutex *)0x116894);
      fprintf(_stderr,"FATAL ERROR! pool allocator get wild %p\n",local_10);
      ncnn::fastFree((void *)0x1168bb);
      return;
    }
    ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1167b9);
    if (ppVar2->second == local_10) break;
    in_stack_ffffffffffffffb0 =
         std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_18,0);
  }
  ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1167d2);
  local_28 = ppVar2->first;
  __y = &in_RDI._M_node[7]._M_prev;
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_30,&local_18);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (in_stack_ffffffffffffffa0,in_RDI);
  Mutex::unlock((Mutex *)0x11681a);
  Mutex::lock((Mutex *)0x116828);
  std::make_pair<unsigned_long&,void*&>((unsigned_long *)(in_RDI._M_node + 6),__y);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back((list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             *)in_stack_ffffffffffffffb0._M_node,(value_type *)in_RDI._M_node);
  Mutex::unlock((Mutex *)0x11686c);
  return;
}

Assistant:

void PoolAllocator::fastFree(void* ptr)
{
    payouts_lock.lock();

    // return to budgets
    std::list< std::pair<size_t, void*> >::iterator it = payouts.begin();
    for (; it != payouts.end(); it++)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            payouts.erase(it);

            payouts_lock.unlock();

            budgets_lock.lock();

            budgets.push_back(std::make_pair(size, ptr));

            budgets_lock.unlock();

            return;
        }
    }

    payouts_lock.unlock();

    fprintf(stderr, "FATAL ERROR! pool allocator get wild %p\n", ptr);
    ncnn::fastFree(ptr);
}